

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsPresolveStatus __thiscall
Highs::runPresolve(Highs *this,bool force_lp_presolve,bool force_presolve)

{
  PresolveComponent *this_00;
  HighsSparseMatrix *this_01;
  HighsTimer *this_02;
  HighsLogOptions *pHVar1;
  HighsModel *this_03;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  HighsPresolveStatus HVar9;
  size_t __n;
  double *pdVar10;
  pointer pcVar11;
  pointer ppVar12;
  pointer piVar13;
  pointer puVar14;
  pointer pNVar15;
  pointer pHVar16;
  int iVar17;
  HighsPresolveStatus presolve_status;
  HighsInt HVar18;
  HighsInt HVar19;
  HighsLp *pHVar20;
  size_t in_RCX;
  double dVar21;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Highs *this_04;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsMipSolver solver;
  HighsPostsolveStack local_300;
  undefined1 local_220 [360];
  HighsTimer local_b8;
  
  this_00 = &this->presolve_;
  PresolveComponent::clear(this_00);
  __n = (this->options_).super_HighsOptionsStruct.presolve._M_string_length;
  bVar23 = true;
  if (__n == ::kHighsOffString_abi_cxx11_._M_string_length) {
    if (__n == 0) {
      bVar23 = false;
    }
    else {
      iVar17 = bcmp((this->options_).super_HighsOptionsStruct.presolve._M_dataplus._M_p,
                    ::kHighsOffString_abi_cxx11_._M_dataplus._M_p,__n);
      bVar23 = iVar17 != 0;
    }
  }
  presolve_status = kNotPresolved;
  if (((bVar23 | force_presolve) == 1) &&
     (presolve_status = kNotReduced,
     (this->model_).lp_.num_row_ != 0 || (this->model_).lp_.num_col_ != 0)) {
    this_01 = &(this->model_).lp_.a_matrix_;
    HighsSparseMatrix::ensureColwise(this_01);
    presolve_status = kNullError;
    if ((this->model_).lp_.num_row_ != 0 || (this->model_).lp_.num_col_ != 0) {
      this_02 = &this->timer_;
      pdVar10 = (this->timer_).clock_start.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __buf = extraout_RDX;
      if (0.0 < *pdVar10 || *pdVar10 == 0.0) {
        HighsTimer::start(this_02,0);
        __buf = extraout_RDX_00;
      }
      HighsTimer::read(this_02,0,__buf,in_RCX);
      dVar5 = (this->options_).super_HighsOptionsStruct.time_limit;
      dVar21 = ABS(dVar5);
      if ((0x3fe < (uint)((ulong)((long)dVar21 + -0x10000000000000) >> 0x35) || -1 < (long)dVar5) &&
          ((dVar21 != INFINITY && (dVar21 != 0.0 && (ulong)dVar21 < 0x7ff0000000000000)) &&
          (0xffffffffffffe < (long)dVar21 - 1U || -1 < (long)dVar5))) {
        pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
        if (dVar5 - extraout_XMM0_Qa <= 0.0) {
          highsLogDev(pHVar1,kError,"Time limit reached while reading in matrix\n");
          return kTimeout;
        }
        highsLogDev(pHVar1,kVerbose,
                    "Time limit set: reading matrix took %.2g, presolve time left: %.2g\n");
      }
      this_03 = &this->model_;
      bVar23 = HighsLp::isMip(&this_03->lp_);
      if (bVar23 && !force_lp_presolve) {
        HighsMipSolver::HighsMipSolver
                  ((HighsMipSolver *)local_220,&this->callback_,&this->options_,&this_03->lp_,
                   &this->solution_,false,0);
        HighsTimer::start(&local_b8,0);
        HighsMipSolver::runPresolve
                  ((HighsMipSolver *)local_220,
                   (this->options_).super_HighsOptionsStruct.presolve_reduction_limit);
        presolve_status = HighsMipSolver::getPresolveStatus((HighsMipSolver *)local_220);
        pHVar20 = HighsMipSolver::getPresolvedModel((HighsMipSolver *)local_220);
        HighsLp::operator=(&(this->presolve_).data_.reduced_lp_,pHVar20);
        this_04 = (Highs *)local_220;
        HighsMipSolver::getPostsolveStack(&local_300,(HighsMipSolver *)this_04);
        (this->presolve_).data_.postSolveStack.debug_prev_row_upper = local_300.debug_prev_row_upper
        ;
        (this->presolve_).data_.postSolveStack.debug_prev_col_upper = local_300.debug_prev_col_upper
        ;
        (this->presolve_).data_.postSolveStack.debug_prev_row_lower = local_300.debug_prev_row_lower
        ;
        (this->presolve_).data_.postSolveStack.debug_prev_numreductions =
             local_300.debug_prev_numreductions;
        (this->presolve_).data_.postSolveStack.debug_prev_col_lower = local_300.debug_prev_col_lower
        ;
        pcVar11 = (this->presolve_).data_.postSolveStack.reductionValues.data.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        (this->presolve_).data_.postSolveStack.reductionValues.data.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
             local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.reductionValues.data.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl + 8) =
             local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.reductionValues.data.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl + 0x10) =
             local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pcVar11 != (pointer)0x0) {
          operator_delete(pcVar11);
        }
        (this->presolve_).data_.postSolveStack.reductionValues.position =
             local_300.reductionValues.position;
        ppVar12 = (this->presolve_).data_.postSolveStack.reductions.
                  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (this->presolve_).data_.postSolveStack.reductions.
        super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_300.reductions.
             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.reductions.
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data + 8) =
             local_300.reductions.
             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.reductions.
                 super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data + 0x10) =
             local_300.reductions.
             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_300.reductions.
        super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.reductions.
        super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.reductions.
        super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar12 != (pointer)0x0) {
          operator_delete(ppVar12);
        }
        piVar13 = (this->presolve_).data_.postSolveStack.origColIndex.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        (this->presolve_).data_.postSolveStack.origColIndex.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.origColIndex.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8)
             = local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.origColIndex.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
         0x10) = local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (piVar13 != (pointer)0x0) {
          operator_delete(piVar13);
        }
        piVar13 = (this->presolve_).data_.postSolveStack.origRowIndex.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        (this->presolve_).data_.postSolveStack.origRowIndex.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.origRowIndex.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8)
             = local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.origRowIndex.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
         0x10) = local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (piVar13 != (pointer)0x0) {
          operator_delete(piVar13);
        }
        puVar14 = (this->presolve_).data_.postSolveStack.linearlyTransformable.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (this->presolve_).data_.postSolveStack.linearlyTransformable.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_300.linearlyTransformable.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.linearlyTransformable.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8) =
             local_300.linearlyTransformable.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.linearlyTransformable.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 0x10) =
             local_300.linearlyTransformable.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_300.linearlyTransformable.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.linearlyTransformable.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.linearlyTransformable.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar14 != (pointer)0x0) {
          operator_delete(puVar14);
        }
        pNVar15 = (this->presolve_).data_.postSolveStack.rowValues.
                  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (this->presolve_).data_.postSolveStack.rowValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_300.rowValues.
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.rowValues.
                 super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                 ._M_impl.super__Vector_impl_data + 8) =
             local_300.rowValues.
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.rowValues.
                 super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                 ._M_impl.super__Vector_impl_data + 0x10) =
             local_300.rowValues.
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_300.rowValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.rowValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.rowValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pNVar15 != (pointer)0x0) {
          operator_delete(pNVar15);
        }
        pNVar15 = (this->presolve_).data_.postSolveStack.colValues.
                  super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (this->presolve_).data_.postSolveStack.colValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_300.colValues.
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.colValues.
                 super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                 ._M_impl.super__Vector_impl_data + 8) =
             local_300.colValues.
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(this->presolve_).data_.postSolveStack.colValues.
                 super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                 ._M_impl.super__Vector_impl_data + 0x10) =
             local_300.colValues.
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_300.colValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_300.colValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_300.colValues.
        super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pNVar15 != (pointer)0x0) {
          operator_delete(pNVar15);
        }
        (this->presolve_).data_.postSolveStack.origNumCol = local_300.origNumCol;
        (this->presolve_).data_.postSolveStack.origNumRow = local_300.origNumRow;
        if (local_300.colValues.
            super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.colValues.
                          super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_300.rowValues.
            super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.rowValues.
                          super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_300.linearlyTransformable.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.linearlyTransformable.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.origRowIndex.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.origColIndex.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_300.reductions.
            super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.reductions.
                          super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_300.reductionValues.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_300.reductionValues.data.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        (this->presolve_).presolve_status_ = presolve_status;
        HighsMipSolver::~HighsMipSolver((HighsMipSolver *)local_220);
      }
      else {
        PresolveComponent::init(this_00,(EVP_PKEY_CTX *)this_03);
        (this->presolve_).options_ = &this->options_;
        dVar5 = (this->options_).super_HighsOptionsStruct.time_limit;
        dVar21 = ABS(dVar5);
        bVar23 = (long)dVar21 - 1U < 0xfffffffffffff;
        bVar25 = (long)dVar5 < 0;
        bVar24 = dVar21 == 0.0;
        this_04 = (Highs *)CONCAT71(0xfffffffffff,bVar24);
        bVar22 = (uint)((long)dVar21 + 0xfff0000000000000U >> 0x35) < 0x3ff;
        if ((!bVar22 || !bVar25) &&
            ((dVar21 != INFINITY && (!bVar24 && 0x7fefffffffffffff >= (ulong)dVar21)) &&
            (!bVar23 || !bVar25))) {
          HighsTimer::read(this_02,0,&DAT_fff0000000000000,
                           CONCAT71((uint7)((long)dVar21 + 0xfff0000000000000U >> 0x3d),
                                    bVar22 && bVar25 ||
                                    ((dVar21 == INFINITY ||
                                     (bVar24 || 0x7fefffffffffffff < (ulong)dVar21)) ||
                                    bVar23 && bVar25)));
          pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
          if ((((this->presolve_).options_)->super_HighsOptionsStruct).time_limit -
              (extraout_XMM0_Qa_00 - extraout_XMM0_Qa) <= 0.0) {
            highsLogDev(pHVar1,kError,"Time limit reached while copying matrix into presolve.\n");
            return kTimeout;
          }
          this_04 = (Highs *)0x3;
          highsLogDev(pHVar1,kVerbose,
                      "Time limit set: copying matrix took %.2g, presolve time left: %.2g\n");
        }
        presolve_status = PresolveComponent::run(this_00);
      }
      presolveStatusToString_abi_cxx11_((string *)local_220,this_04,presolve_status);
      highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kVerbose,
                  "presolve_.run() returns status: %s\n",local_220._0_8_);
      if ((HighsCallback *)local_220._0_8_ != (HighsCallback *)(local_220 + 0x10)) {
        operator_delete((void *)local_220._0_8_);
      }
      std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator=
                (&(this->presolve_log_).rule,&(this->presolve_).data_.presolve_log_.rule);
      HVar9 = (this->presolve_).presolve_status_;
      if (HVar9 == kReduced) {
        uVar3 = (this->model_).lp_.num_col_;
        uVar7 = (this->model_).lp_.num_row_;
        uVar4 = (this->presolve_).data_.reduced_lp_.num_col_;
        uVar8 = (this->presolve_).data_.reduced_lp_.num_row_;
        (this->presolve_).info_.n_rows_removed = uVar7 - uVar8;
        (this->presolve_).info_.n_cols_removed = uVar3 - uVar4;
        HVar18 = HighsSparseMatrix::numNz(this_01);
        HVar19 = HighsSparseMatrix::numNz(&(this->presolve_).data_.reduced_lp_.a_matrix_);
        (this->presolve_).info_.n_nnz_removed = HVar18 - HVar19;
        HighsLp::clearScale(&(this->presolve_).data_.reduced_lp_);
      }
      else if (HVar9 == kReducedToEmpty) {
        uVar2 = (this->model_).lp_.num_col_;
        uVar6 = (this->model_).lp_.num_row_;
        (this->presolve_).info_.n_rows_removed = uVar6;
        (this->presolve_).info_.n_cols_removed = uVar2;
        HVar18 = HighsSparseMatrix::numNz(this_01);
        (this->presolve_).info_.n_nnz_removed = HVar18;
      }
      bVar23 = HighsLp::isMip(&this_03->lp_);
      if ((!bVar23) &&
         (pHVar16 = (this->presolve_).data_.reduced_lp_.integrality_.
                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                    super__Vector_impl_data._M_start,
         *(pointer *)
          ((long)&(this->presolve_).data_.reduced_lp_.integrality_.
                  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                  super__Vector_impl_data + 8) != pHVar16)) {
        *(pointer *)
         ((long)&(this->presolve_).data_.reduced_lp_.integrality_.
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data + 8) = pHVar16;
      }
    }
  }
  return presolve_status;
}

Assistant:

HighsPresolveStatus Highs::runPresolve(const bool force_lp_presolve,
                                       const bool force_presolve) {
  presolve_.clear();
  // Exit if presolve is set to off (unless presolve is forced)
  if (options_.presolve == kHighsOffString && !force_presolve)
    return HighsPresolveStatus::kNotPresolved;

  if (model_.isEmpty()) {
    // Empty models shouldn't reach here, but this status would cause
    // no harm if one did
    assert(1 == 0);
    return HighsPresolveStatus::kNotReduced;
  }

  // Ensure that the LP is column-wise
  HighsLp& original_lp = model_.lp_;
  original_lp.ensureColwise();

  if (original_lp.num_col_ == 0 && original_lp.num_row_ == 0)
    return HighsPresolveStatus::kNullError;

  // Ensure that the timer is running
  if (!timer_.running()) timer_.start();
  double start_presolve = timer_.read();

  // Set time limit.
  if (options_.time_limit > 0 && options_.time_limit < kHighsInf) {
    double left = options_.time_limit - start_presolve;
    if (left <= 0) {
      highsLogDev(options_.log_options, HighsLogType::kError,
                  "Time limit reached while reading in matrix\n");
      return HighsPresolveStatus::kTimeout;
    }

    highsLogDev(options_.log_options, HighsLogType::kVerbose,
                "Time limit set: reading matrix took %.2g, presolve "
                "time left: %.2g\n",
                start_presolve, left);
  }

  // Presolve.
  HighsPresolveStatus presolve_return_status =
      HighsPresolveStatus::kNotPresolved;
  if (model_.isMip() && !force_lp_presolve) {
    // Use presolve for MIP
    //
    // Presolved model is extracted now since it's part of solver,
    // which is lost on return
    HighsMipSolver solver(callback_, options_, original_lp, solution_);
    // Start the MIP solver's timer so that timeout in presolve can be
    // identified
    solver.timer_.start();
    // Only place that HighsMipSolver::runPresolve is called
    solver.runPresolve(options_.presolve_reduction_limit);
    presolve_return_status = solver.getPresolveStatus();
    // Assign values to data members of presolve_
    presolve_.data_.reduced_lp_ = solver.getPresolvedModel();
    presolve_.data_.postSolveStack = solver.getPostsolveStack();
    presolve_.presolve_status_ = presolve_return_status;
    //    presolve_.data_.presolve_log_ =
  } else {
    // Use presolve for LP
    presolve_.init(original_lp, timer_);
    presolve_.options_ = &options_;
    if (options_.time_limit > 0 && options_.time_limit < kHighsInf) {
      double current = timer_.read();
      double time_init = current - start_presolve;
      double left = presolve_.options_->time_limit - time_init;
      if (left <= 0) {
        highsLogDev(options_.log_options, HighsLogType::kError,
                    "Time limit reached while copying matrix into presolve.\n");
        return HighsPresolveStatus::kTimeout;
      }
      highsLogDev(options_.log_options, HighsLogType::kVerbose,
                  "Time limit set: copying matrix took %.2g, presolve "
                  "time left: %.2g\n",
                  time_init, left);
    }

    presolve_return_status = presolve_.run();
  }

  highsLogDev(options_.log_options, HighsLogType::kVerbose,
              "presolve_.run() returns status: %s\n",
              presolveStatusToString(presolve_return_status).c_str());

  // Update reduction counts.
  assert(presolve_return_status == presolve_.presolve_status_);
  presolve_log_ = presolve_.getPresolveLog();
  switch (presolve_.presolve_status_) {
    case HighsPresolveStatus::kReduced: {
      HighsLp& reduced_lp = presolve_.getReducedProblem();
      presolve_.info_.n_cols_removed =
          original_lp.num_col_ - reduced_lp.num_col_;
      presolve_.info_.n_rows_removed =
          original_lp.num_row_ - reduced_lp.num_row_;
      presolve_.info_.n_nnz_removed = (HighsInt)original_lp.a_matrix_.numNz() -
                                      (HighsInt)reduced_lp.a_matrix_.numNz();
      // Clear any scaling information inherited by the reduced LP
      reduced_lp.clearScale();
      assert(lpDimensionsOk("RunPresolve: reduced_lp", reduced_lp,
                            options_.log_options));
      break;
    }
    case HighsPresolveStatus::kReducedToEmpty: {
      presolve_.info_.n_cols_removed = original_lp.num_col_;
      presolve_.info_.n_rows_removed = original_lp.num_row_;
      presolve_.info_.n_nnz_removed = (HighsInt)original_lp.a_matrix_.numNz();
      break;
    }
    default:
      break;
  }
  // Presolve creates integrality vector for an LP, so clear it
  if (!model_.isMip()) presolve_.data_.reduced_lp_.integrality_.clear();

  return presolve_return_status;
}